

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

DatabaseInterface * Fossilize::create_dumb_folder_database(char *directory_path,DatabaseMode mode)

{
  DumbDirectoryDatabase *this;
  allocator local_41;
  string local_40;
  
  this = (DumbDirectoryDatabase *)operator_new(0x268);
  std::__cxx11::string::string((string *)&local_40,directory_path,&local_41);
  DumbDirectoryDatabase::DumbDirectoryDatabase(this,&local_40,mode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return &this->super_DatabaseInterface;
}

Assistant:

DatabaseInterface *create_dumb_folder_database(const char *directory_path, DatabaseMode mode)
{
	auto *db = new DumbDirectoryDatabase(directory_path, mode);
	return db;
}